

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::
Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
::dispose(Own<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>_>
          *this)

{
  Impl<kj::MainBuilder::MainImpl> *this_00;
  Disposer *in_RDX;
  
  this_00 = this->ptr;
  if (this_00 != (Impl<kj::MainBuilder::MainImpl> *)0x0) {
    this->ptr = (Impl<kj::MainBuilder::MainImpl> *)0x0;
    Disposer::
    Dispose_<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>,_true>
    ::dispose((Dispose_<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::Impl<kj::MainBuilder::MainImpl>,_true>
               *)this_00,(Impl<kj::MainBuilder::MainImpl> *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }